

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

int yang_check_deviate_must
              (lys_module *module,unres_schema *unres,lys_deviate *deviate,lys_node *dev_target)

{
  LYS_NODE LVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  LY_ERR *pLVar5;
  uint8_t *local_58;
  uint8_t *trg_must_size;
  lys_restr *must;
  lys_restr **trg_must;
  int local_38;
  int erase_must;
  int j;
  int i;
  lys_node *dev_target_local;
  lys_deviate *deviate_local;
  unres_schema *unres_local;
  lys_module *module_local;
  
  bVar2 = true;
  LVar1 = dev_target->nodetype;
  if (LVar1 == LYS_CONTAINER) {
    local_58 = dev_target->padding + 2;
  }
  else if (LVar1 == LYS_LEAF) {
    local_58 = dev_target->padding + 3;
  }
  else if (LVar1 == LYS_LEAFLIST) {
    local_58 = dev_target->padding + 3;
  }
  else if (LVar1 == LYS_LIST) {
    local_58 = dev_target->padding;
  }
  else {
    if ((LVar1 != LYS_ANYXML) && (LVar1 != LYS_ANYDATA)) {
      ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,"must");
      ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Target node does not allow \"must\" property.");
      goto LAB_00170bd3;
    }
    local_58 = dev_target->padding + 3;
  }
  must = (lys_restr *)&dev_target[1].dsc;
  dev_target->flags = dev_target->flags & 0xfdff;
  if (deviate->mod == LY_DEVIATE_ADD) {
    pcVar4 = (char *)ly_realloc(must->expr,
                                (long)(int)((uint)deviate->must_size + (uint)*local_58) * 0x38);
    if (pcVar4 == (char *)0x0) {
      pLVar5 = ly_errno_location();
      *pLVar5 = LY_EMEM;
      ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_check_deviate_must");
      goto LAB_00170bd3;
    }
    must->expr = pcVar4;
    memcpy(must->expr + (ulong)*local_58 * 0x38,deviate->must,(ulong)deviate->must_size * 0x38);
    free(deviate->must);
    deviate->must = (lys_restr *)(pcVar4 + (ulong)*local_58 * 0x38);
    *local_58 = *local_58 + deviate->must_size;
    bVar2 = false;
  }
  else if (deviate->mod == LY_DEVIATE_DEL) {
    for (local_38 = 0; local_38 < (int)(uint)deviate->must_size; local_38 = local_38 + 1) {
      for (erase_must = 0; erase_must < (int)(uint)*local_58; erase_must = erase_must + 1) {
        if (deviate->must[local_38].expr == *(char **)(must->expr + (long)erase_must * 0x38)) {
          lys_restr_free(module->ctx,(lys_restr *)(must->expr + (long)erase_must * 0x38));
          *local_58 = *local_58 - 1;
          if (erase_must != (uint)*local_58) {
            memcpy(must->expr + (long)erase_must * 0x38,must->expr + (ulong)*local_58 * 0x38,0x38);
          }
          if (*local_58 == 0) {
            free(must->expr);
            must->expr = (char *)0x0;
          }
          else {
            memset(must->expr + (ulong)*local_58 * 0x38,0,0x38);
          }
          erase_must = -1;
          break;
        }
      }
      if (erase_must != -1) {
        ly_vlog(LYE_INARG,LY_VLOG_NONE,(void *)0x0,deviate->must[local_38].expr,"must");
        ly_vlog(LYE_SPEC,LY_VLOG_NONE,(void *)0x0,"Value does not match any must from the target.");
        goto LAB_00170bd3;
      }
    }
  }
  iVar3 = yang_check_must(module,deviate->must,(uint)deviate->must_size,unres);
  if ((iVar3 == 0) &&
     ((*local_58 == 0 ||
      (iVar3 = unres_schema_add_node(module,unres,dev_target,UNRES_XPATH,(lys_node *)0x0),
      iVar3 == 0)))) {
    return 0;
  }
LAB_00170bd3:
  if ((deviate->mod == LY_DEVIATE_ADD) && (bVar2)) {
    for (erase_must = 0; erase_must < (int)(uint)deviate->must_size; erase_must = erase_must + 1) {
      lys_restr_free(module->ctx,deviate->must + erase_must);
    }
    free(deviate->must);
  }
  return 1;
}

Assistant:

int
yang_check_deviate_must(struct lys_module *module, struct unres_schema *unres,
                        struct lys_deviate *deviate, struct lys_node *dev_target)
{
    int i, j, erase_must = 1;
    struct lys_restr **trg_must, *must;
    uint8_t *trg_must_size;

    /* check target node type */
    switch (dev_target->nodetype) {
        case LYS_LEAF:
            trg_must = &((struct lys_node_leaf *)dev_target)->must;
            trg_must_size = &((struct lys_node_leaf *)dev_target)->must_size;
            break;
        case LYS_CONTAINER:
            trg_must = &((struct lys_node_container *)dev_target)->must;
            trg_must_size = &((struct lys_node_container *)dev_target)->must_size;
            break;
        case LYS_LEAFLIST:
            trg_must = &((struct lys_node_leaflist *)dev_target)->must;
            trg_must_size = &((struct lys_node_leaflist *)dev_target)->must_size;
            break;
        case LYS_LIST:
            trg_must = &((struct lys_node_list *)dev_target)->must;
            trg_must_size = &((struct lys_node_list *)dev_target)->must_size;
            break;
        case LYS_ANYXML:
        case LYS_ANYDATA:
            trg_must = &((struct lys_node_anydata *)dev_target)->must;
            trg_must_size = &((struct lys_node_anydata *)dev_target)->must_size;
            break;
        default:
            LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, "must");
            LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Target node does not allow \"must\" property.");
            goto error;
    }

    /* flag will be checked again, clear it for now */
    dev_target->flags &= ~LYS_XPATH_DEP;

    if (deviate->mod == LY_DEVIATE_ADD) {
        /* reallocate the must array of the target */
        must = ly_realloc(*trg_must, (deviate->must_size + *trg_must_size) * sizeof *must);
        if (!must) {
            LOGMEM;
            goto error;
        }
        *trg_must = must;
        memcpy(&(*trg_must)[*trg_must_size], deviate->must, deviate->must_size * sizeof *must);
        free(deviate->must);
        deviate->must = &must[*trg_must_size];
        *trg_must_size = *trg_must_size + deviate->must_size;
        erase_must = 0;
    } else if (deviate->mod == LY_DEVIATE_DEL) {
        /* find must to delete, we are ok with just matching conditions */
        for (j = 0; j < deviate->must_size; ++j) {
            for (i = 0; i < *trg_must_size; i++) {
                if (ly_strequal(deviate->must[j].expr, (*trg_must)[i].expr, 1)) {
                    /* we have a match, free the must structure ... */
                    lys_restr_free(module->ctx, &((*trg_must)[i]));
                    /* ... and maintain the array */
                    (*trg_must_size)--;
                    if (i != *trg_must_size) {
                        memcpy(&(*trg_must)[i], &(*trg_must)[*trg_must_size], sizeof *must);
                    }
                    if (!(*trg_must_size)) {
                        free(*trg_must);
                        *trg_must = NULL;
                    } else {
                        memset(&(*trg_must)[*trg_must_size], 0, sizeof *must);
                    }

                    i = -1; /* set match flag */
                    break;
                }
            }
            if (i != -1) {
                /* no match found */
                LOGVAL(LYE_INARG, LY_VLOG_NONE, NULL, deviate->must[j].expr, "must");
                LOGVAL(LYE_SPEC, LY_VLOG_NONE, NULL, "Value does not match any must from the target.");
                goto error;
            }
        }
    }

    if (yang_check_must(module, deviate->must, deviate->must_size, unres)) {
        goto error;
    }
    /* check XPath dependencies */
    if (*trg_must_size && unres_schema_add_node(module, unres, dev_target, UNRES_XPATH, NULL)) {
        goto error;
    }

    return EXIT_SUCCESS;
error:
    if (deviate->mod == LY_DEVIATE_ADD && erase_must) {
        for (i = 0; i < deviate->must_size; ++i) {
            lys_restr_free(module->ctx, &deviate->must[i]);
        }
        free(deviate->must);
    }
    return EXIT_FAILURE;
}